

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
             *this,wchar_t **it)

{
  wchar_t *pwVar1;
  
  pwVar1 = *it;
  if (*(unsigned_long *)(this + 8) != 0) {
    pwVar1 = std::copy_n<char_const*,unsigned_long,wchar_t*>
                       (*(char **)this,*(unsigned_long *)(this + 8),pwVar1);
    *it = pwVar1;
  }
  pwVar1 = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>
                     (pwVar1,*(undefined8 *)(this + 0x18),this + 0x10);
  *it = pwVar1;
  int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::hex_writer::operator()
            ((hex_writer *)(this + 0x20),it);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = std::copy_n(prefix.data(), prefix.size(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }